

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O0

void __thiscall iqnet::Reactor<iqnet::Null_lock>::Reactor(Reactor<iqnet::Null_lock> *this)

{
  Reactor<iqnet::Null_lock> *this_local;
  
  Reactor_base::Reactor_base(&this->super_Reactor_base);
  (this->super_Reactor_base)._vptr_Reactor_base = (_func_int **)&PTR__Reactor_00251d20;
  Reactor_poll_impl::Reactor_poll_impl(&this->impl);
  std::
  map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
  ::map(&this->handlers);
  std::__cxx11::
  list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::list
            (&this->handlers_states);
  this->num_stoppers = 0;
  return;
}

Assistant:

Reactor<Lock>::Reactor():
  num_stoppers(0)
{
}